

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scp.c
# Opt level: O1

LIBSSH2_CHANNEL * libssh2_scp_recv(LIBSSH2_SESSION *session,char *path,stat *sb)

{
  int iVar1;
  time_t start_time;
  LIBSSH2_CHANNEL *pLVar2;
  libssh2_struct_stat *sb_00;
  libssh2_struct_stat sb_intl;
  libssh2_struct_stat local_c0;
  
  sb_00 = &local_c0;
  memset(sb_00,0,0x90);
  if (sb == (stat *)0x0) {
    sb_00 = (libssh2_struct_stat *)0x0;
  }
  start_time = time((time_t *)0x0);
  do {
    pLVar2 = scp_recv(session,path,sb_00);
    if ((session->api_block_mode == 0) || (pLVar2 != (LIBSSH2_CHANNEL *)0x0)) break;
    iVar1 = libssh2_session_last_errno(session);
    if (iVar1 != -0x25) break;
    iVar1 = _libssh2_wait_socket(session,start_time);
  } while (iVar1 == 0);
  if (sb != (stat *)0x0) {
    memset(sb,0,0x90);
    (sb->st_mtim).tv_sec = local_c0.st_mtim.tv_sec;
    (sb->st_atim).tv_sec = local_c0.st_atim.tv_sec;
    sb->st_size = local_c0.st_size;
    sb->st_mode = local_c0.st_mode;
  }
  return pLVar2;
}

Assistant:

LIBSSH2_API LIBSSH2_CHANNEL *
libssh2_scp_recv(LIBSSH2_SESSION *session, const char *path, struct stat *sb)
{
    LIBSSH2_CHANNEL *ptr;

    /* scp_recv uses libssh2_struct_stat, so pass one if the caller gave us a
       struct to populate... */
    libssh2_struct_stat sb_intl;
    libssh2_struct_stat *sb_ptr;
    memset(&sb_intl, 0, sizeof(sb_intl));
    sb_ptr = sb ? &sb_intl : NULL;

    BLOCK_ADJUST_ERRNO(ptr, session, scp_recv(session, path, sb_ptr));

    /* ...and populate the caller's with as much info as fits. */
    if(sb) {
        memset(sb, 0, sizeof(struct stat));

        sb->st_mtime = sb_intl.st_mtime;
        sb->st_atime = sb_intl.st_atime;
        sb->st_size = (off_t)sb_intl.st_size;
        sb->st_mode = sb_intl.st_mode;
    }

    return ptr;
}